

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::try_statement::try_statement
          (try_statement *this,source_extend *extend,statement_ptr *block,statement_ptr *catch_,
          wstring *catch_id,statement_ptr *finally_)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer psVar5;
  statement_ptr *finally__local;
  wstring *catch_id_local;
  statement_ptr *catch__local;
  statement_ptr *block_local;
  source_extend *extend_local;
  try_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__try_statement_002968f0;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->block_,block);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->catch_,catch_);
  std::__cxx11::wstring::wstring((wstring *)&this->catch_id_,(wstring *)catch_id);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->finally_,finally_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->block_);
  bVar2 = false;
  if (bVar1) {
    psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (&this->block_);
    iVar4 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
    bVar2 = iVar4 == 0;
  }
  if (!bVar2) {
    __assert_fail("block_ && block_->type() == statement_type::block",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x394,
                  "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                 );
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->catch_);
  bVar3 = std::__cxx11::wstring::empty();
  if (((bVar2 ^ 0xffU) & 1) != (bVar3 & 1)) {
    __assert_fail("!this->catch_ == catch_id_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x395,
                  "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->catch_);
  bVar2 = true;
  if (bVar1) {
    psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (&this->catch_);
    iVar4 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
    bVar2 = iVar4 == 0;
  }
  if (bVar2) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->finally_);
    bVar2 = true;
    if (bVar1) {
      psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                         (&this->finally_);
      iVar4 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
      bVar2 = iVar4 == 0;
    }
    if (bVar2) {
      return;
    }
    __assert_fail("!this->finally_ || this->finally_->type() == statement_type::block",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x397,
                  "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                 );
  }
  __assert_fail("!this->catch_ || this->catch_->type() == statement_type::block",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x396,
                "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
               );
}

Assistant:

explicit try_statement(const source_extend& extend, statement_ptr&& block, statement_ptr&& catch_, const std::wstring& catch_id, statement_ptr&& finally_)
        : statement(extend)
        , block_(std::move(block))
        , catch_(std::move(catch_))
        , catch_id_(catch_id)
        , finally_(std::move(finally_)) {
        assert(block_ && block_->type() == statement_type::block);
        assert(!this->catch_ == catch_id_.empty());
        assert(!this->catch_ || this->catch_->type() == statement_type::block);
        assert(!this->finally_ || this->finally_->type() == statement_type::block);
    }